

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O2

void verify_sparse_file(archive *a,char *path,sparse *sparse,int blocks)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  archive_entry *entry;
  long lVar4;
  uint uVar5;
  int64_t offset;
  size_t bytes_read;
  void *buff;
  
  create_sparse_file(path,sparse);
  entry = archive_entry_new();
  lVar4 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'Ć',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  wVar2 = archive_read_disk_open(a,path);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ć',0,"ARCHIVE_OK",(long)wVar2,"archive_read_disk_open(a, path)",a);
  iVar3 = archive_read_next_header2(a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header2(a, ae)",a);
  wVar2 = archive_entry_sparse_count(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Č',(ulong)(uint)blocks,"blocks",(long)wVar2,
                      "archive_entry_sparse_count(ae)",(void *)0x0);
  uVar5 = 0;
  bVar1 = false;
  while( true ) {
    iVar3 = archive_read_data_block(a,&buff,&bytes_read,&offset);
    if (iVar3 != 0) break;
    if (lVar4 < offset) {
      bVar1 = true;
    }
    uVar5 = uVar5 + (lVar4 < offset || offset == 0);
    lVar4 = offset + bytes_read;
  }
  if (!bVar1 && uVar5 == 1) {
    uVar5 = 0;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ě',(ulong)(uint)blocks,"blocks",(ulong)uVar5,"data_blocks",(void *)0x0);
  iVar3 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ĝ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",a);
  archive_entry_free(entry);
  return;
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int blocks)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset;
	int64_t total;
	int data_blocks, hole;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	/* Verify the number of holes only, not its offset nor its
	 * length because those alignments are deeply dependence on
	 * its filesystem. */ 
	assertEqualInt(blocks, archive_entry_sparse_count(ae));
	total = 0;
	data_blocks = 0;
	hole = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		if (offset > total || offset == 0) {
			if (offset > total)
				hole = 1;
			data_blocks++;
		}
		total = offset + bytes_read;
	}
	if (!hole && data_blocks == 1)
		data_blocks = 0;/* There are no holes */
	assertEqualInt(blocks, data_blocks);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}